

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_check_pubkey(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  mbedtls_mpi *X;
  int iVar1;
  int iVar2;
  undefined1 local_50 [8];
  mbedtls_mpi YY;
  mbedtls_mpi RHS;
  
  iVar1 = mbedtls_mpi_cmp_int(&pt->Z,1);
  iVar2 = -0x4c80;
  if (((iVar1 == 0) && (iVar2 = -0x4f80, (grp->G).X.p != (mbedtls_mpi_uint *)0x0)) &&
     ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
    iVar1 = mbedtls_mpi_cmp_int(&pt->X,0);
    iVar2 = -0x4c80;
    if (-1 < iVar1) {
      X = &pt->Y;
      iVar1 = mbedtls_mpi_cmp_int(X,0);
      if (-1 < iVar1) {
        iVar1 = mbedtls_mpi_cmp_mpi(&pt->X,&grp->P);
        if ((iVar1 < 0) && (iVar1 = mbedtls_mpi_cmp_mpi(X,&grp->P), iVar1 < 0)) {
          mbedtls_mpi_init((mbedtls_mpi *)local_50);
          mbedtls_mpi_init((mbedtls_mpi *)&YY.s);
          iVar2 = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_50,X,X);
          if ((iVar2 == 0) && (iVar2 = ecp_sw_rhs(grp,(mbedtls_mpi *)&YY.s,&pt->X), iVar2 == 0)) {
            iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_50,(mbedtls_mpi *)&YY.s);
            iVar2 = -0x4c80;
            if (iVar1 == 0) {
              iVar2 = 0;
            }
          }
          mbedtls_mpi_free((mbedtls_mpi *)local_50);
          mbedtls_mpi_free((mbedtls_mpi *)&YY.s);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecp_check_pubkey(const mbedtls_ecp_group *grp,
                             const mbedtls_ecp_point *pt)
{
    /* Must use affine coordinates */
    if (mbedtls_mpi_cmp_int(&pt->Z, 1) != 0) {
        return MBEDTLS_ERR_ECP_INVALID_KEY;
    }

#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        return ecp_check_pubkey_mx(grp, pt);
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        return ecp_check_pubkey_sw(grp, pt);
    }
#endif
    return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
}